

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object_fromEntries(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong uVar4;
  JSRefCountHeader *p_1;
  JSRefCountHeader *p_5;
  JSRefCountHeader *p;
  JSValue this_obj;
  JSValue JVar5;
  JSValue JVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSRefCountHeader *p_4;
  BOOL done;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar11;
  BOOL *in_stack_ffffffffffffff80;
  BOOL *pdone;
  JSValueUnion local_78;
  int local_6c;
  int64_t local_68;
  JSValueUnion local_60;
  JSValue local_58;
  ulong local_48;
  JSValue local_40;
  JSValueUnion JVar3;
  
  JVar6 = *argv;
  JVar5 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
  this_obj.tag = JVar5.tag;
  JVar2 = JVar5.u;
  if ((uint)JVar5.tag == 6) {
LAB_00160080:
    uVar4 = (ulong)JVar2.ptr & 0xffffffff00000000;
  }
  else {
    JVar6 = JS_GetIterator(ctx,JVar6,0);
    uVar4 = JVar6.tag & 0xffffffff;
    if (uVar4 != 6) {
      uVar10 = 0;
      local_48 = uVar4;
      JVar7 = JS_GetPropertyInternal(ctx,JVar6,0x6a,JVar6,0);
      JVar3 = JVar7.u;
      if ((int)JVar7.tag != 6) {
        local_68 = JVar7.tag;
        local_60 = JVar2;
        JVar7 = JS_IteratorNext(ctx,JVar6,JVar7,(int)&local_6c,
                                (JSValue *)CONCAT44(in_stack_ffffffffffffff7c,uVar10),
                                in_stack_ffffffffffffff80);
        uVar4 = JVar7.tag;
        JVar8 = JVar6;
        JVar9 = local_58;
        while (local_58 = JVar8, (uVar4 & 0xffffffff) != 6) {
          JVar2 = JVar7.u;
          if (local_6c != 0) {
            if ((0xfffffff4 < (uint)JVar7.tag) &&
               (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar7);
            }
            if ((0xfffffff4 < (uint)local_68) &&
               (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
              JVar5.tag = local_68;
              JVar5.u.ptr = JVar3.ptr;
              __JS_FreeValueRT(ctx->rt,JVar5);
            }
            JVar2 = local_60;
            if ((0xfffffff4 < (uint)JVar6.tag) &&
               (iVar1 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar1 + -1, iVar1 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar6);
            }
            goto LAB_00160080;
          }
          if ((uVar4 & 0xffffffff) != 0xffffffff) {
            JS_ThrowTypeError(ctx,"not an object");
LAB_001602d4:
            JVar6 = local_58;
            JVar9 = local_58;
            if ((0xfffffff4 < (uint)JVar7.tag) &&
               (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar7);
              JVar9 = local_58;
            }
            break;
          }
          JVar6 = JS_GetPropertyValue(ctx,JVar7,(JSValue)ZEXT816(0));
          if ((uint)JVar6.tag == 6) goto LAB_001602d4;
          local_40 = JS_GetPropertyValue(ctx,JVar7,(JSValue)ZEXT816(1));
          if ((int)local_40.tag == 6) {
            if ((0xfffffff4 < (uint)JVar6.tag) &&
               (iVar1 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar1 + -1, iVar1 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar6);
            }
            goto LAB_001602d4;
          }
          uVar10 = local_40.u._0_4_;
          uVar11 = local_40.u._4_4_;
          this_obj.u.ptr = local_60.ptr;
          pdone = (BOOL *)local_40.tag;
          iVar1 = JS_DefinePropertyValueValue(ctx,this_obj,JVar6,local_40,0x4007);
          if (iVar1 < 0) goto LAB_001602d4;
          iVar1 = *JVar2.ptr;
          *(int *)JVar2.ptr = iVar1 + -1;
          if (iVar1 < 2) {
            __JS_FreeValueRT(ctx->rt,JVar7);
          }
          JVar6 = local_58;
          JVar9.tag = local_68;
          JVar9.u.ptr = JVar3.ptr;
          JVar7 = JS_IteratorNext(ctx,local_58,JVar9,(int)&local_6c,
                                  (JSValue *)CONCAT44(uVar11,uVar10),pdone);
          JVar8 = local_58;
          JVar9 = local_58;
          uVar4 = JVar7.tag;
        }
        local_58 = JVar9;
        JVar7.tag = local_68;
        JVar7.u.ptr = JVar3.ptr;
        JVar2 = local_60;
      }
      local_78 = JVar7.u;
      if ((int)local_48 == -1) {
        JS_IteratorClose(ctx,JVar6,1);
      }
      if ((0xfffffff4 < (uint)JVar7.tag) &&
         (iVar1 = *local_78.ptr, *(int *)local_78.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar7);
      }
    }
    if ((0xfffffff4 < (uint)JVar6.tag) &&
       (iVar1 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar6);
    }
    if ((0xfffffff4 < (uint)JVar5.tag) &&
       (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
      JVar6.tag = this_obj.tag;
      JVar6.u.ptr = JVar2.ptr;
      __JS_FreeValueRT(ctx->rt,JVar6);
    }
    JVar2.float64 = 0.0;
    uVar4 = 0;
    this_obj.tag = 6;
  }
  JVar8.u.ptr = (void *)((ulong)JVar2.ptr & 0xffffffff | uVar4);
  JVar8.tag = this_obj.tag;
  return JVar8;
}

Assistant:

static JSValue js_object_fromEntries(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue obj, iter, next_method = JS_UNDEFINED;
    JSValueConst iterable;
    BOOL done;

    /*  RequireObjectCoercible() not necessary because it is tested in
        JS_GetIterator() by JS_GetProperty() */
    iterable = argv[0];

    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        return obj;
    
    iter = JS_GetIterator(ctx, iterable, FALSE);
    if (JS_IsException(iter))
        goto fail;
    next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
    if (JS_IsException(next_method))
        goto fail;
    
    for(;;) {
        JSValue key, value, item;
        item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
        if (JS_IsException(item))
            goto fail;
        if (done) {
            JS_FreeValue(ctx, item);
            break;
        }
        
        key = JS_UNDEFINED;
        value = JS_UNDEFINED;
        if (!JS_IsObject(item)) {
            JS_ThrowTypeErrorNotAnObject(ctx);
            goto fail1;
        }
        key = JS_GetPropertyUint32(ctx, item, 0);
        if (JS_IsException(key))
            goto fail1;
        value = JS_GetPropertyUint32(ctx, item, 1);
        if (JS_IsException(value)) {
            JS_FreeValue(ctx, key);
            goto fail1;
        }
        if (JS_DefinePropertyValueValue(ctx, obj, key, value,
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0) {
        fail1:
            JS_FreeValue(ctx, item);
            goto fail;
        }
        JS_FreeValue(ctx, item);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    return obj;
 fail:
    if (JS_IsObject(iter)) {
        /* close the iterator object, preserving pending exception */
        JS_IteratorClose(ctx, iter, TRUE);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}